

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gpio.c
# Opt level: O3

void * mraa_gpio_interrupt_handler(void *arg)

{
  uint uVar1;
  code *pcVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  mraa_boolean_t mVar6;
  mraa_result_t mVar7;
  int *fds;
  char *pcVar8;
  ulong uVar9;
  uint *puVar10;
  int *piVar11;
  ulong uVar12;
  ulong uVar13;
  char bu [64];
  char acStack_78 [72];
  
  if (arg == (void *)0x0) {
    pcVar8 = "gpio: interrupt_handler: context is invalid";
  }
  else {
    if (((*(long *)((long)arg + 0x48) != 0) &&
        (pcVar2 = *(code **)(*(long *)((long)arg + 0x48) + 0x90), pcVar2 != (code *)0x0)) &&
       (iVar5 = (*pcVar2)(arg), iVar5 != 0)) {
      return (void *)0x0;
    }
    fds = (int *)calloc((ulong)*(uint *)((long)arg + 0x68),4);
    if (fds != (int *)0x0) {
      mVar6 = mraa_is_sub_platform_id(*arg);
      uVar13 = 0;
      if (mVar6 == 0) {
        if (plat->chardev_capable == 0) {
          uVar13 = 0;
          puVar10 = (uint *)arg;
          do {
            snprintf(acStack_78,0x40,"/sys/class/gpio/gpio%d/value",(ulong)*puVar10);
            iVar5 = open(acStack_78,0);
            fds[uVar13] = iVar5;
            if (iVar5 < 0) {
              uVar1 = *puVar10;
              piVar11 = __errno_location();
              pcVar8 = strerror(*piVar11);
              syslog(3,"gpio%i: interrupt_handler: failed to open \'value\' : %s",(ulong)uVar1,
                     pcVar8);
              iVar5 = (int)uVar13;
              goto LAB_0010b19c;
            }
            uVar13 = uVar13 + 1;
            puVar10 = *(uint **)(puVar10 + 0x20);
          } while (puVar10 != (uint *)0x0);
        }
        else {
          uVar1 = *(uint *)((long)arg + 0x58);
          if ((ulong)uVar1 != 0) {
            lVar3 = *(long *)((long)arg + 0x50);
            uVar9 = 0;
            uVar13 = 0;
            do {
              if (lVar3 == 0) {
                uVar13 = 0;
                break;
              }
              piVar11 = (int *)(uVar9 * 0x40 + lVar3);
              if ((*piVar11 != 0) && (piVar11[4] != 0)) {
                lVar4 = *(long *)(piVar11 + 0xe);
                uVar12 = 0;
                do {
                  fds[(long)(int)uVar13 + uVar12] = *(int *)(lVar4 + uVar12 * 4);
                  uVar12 = uVar12 + 1;
                } while (uVar12 < (uint)piVar11[4]);
                uVar13 = (ulong)(uint)((int)uVar13 + (int)uVar12);
              }
              uVar9 = uVar9 + 1;
            } while (uVar9 != uVar1);
          }
        }
      }
      if (((lang_func->java_attach_thread != (_func_mraa_result_t_varargs *)0x0) &&
          (*(_func_void_void_ptr **)((long)arg + 0x10) == lang_func->java_isr_callback)) &&
         (mVar7 = (*lang_func->java_attach_thread)(), mVar7 != MRAA_SUCCESS)) {
        iVar5 = *(int *)((long)arg + 0x68);
LAB_0010b19c:
        mraa_gpio_close_event_handles_sysfs(fds,iVar5);
        return (void *)0x0;
      }
      do {
        if ((*(long *)((long)arg + 0x48) == 0) ||
           (pcVar2 = *(code **)(*(long *)((long)arg + 0x48) + 0x98), pcVar2 == (code *)0x0)) {
          if (plat->chardev_capable == 0) {
            mraa_gpio_wait_interrupt(fds,(int)uVar13,*(mraa_gpio_events_t *)((long)arg + 0x70));
          }
          else {
            mraa_gpio_chardev_wait_interrupt
                      (fds,(int)uVar13,*(mraa_gpio_events_t *)((long)arg + 0x70));
          }
        }
        else {
          iVar5 = (*pcVar2)(arg);
          if (iVar5 != 0) {
LAB_0010b021:
            pthread_setcancelstate(1,(int *)0x0);
            mraa_gpio_close_event_handles_sysfs(fds,*(int *)((long)arg + 0x68));
            if (lang_func->java_detach_thread == (_func_void_varargs *)0x0) {
              return (void *)0x0;
            }
            if (lang_func->java_delete_global_ref == (_func_void_void_ptr *)0x0) {
              return (void *)0x0;
            }
            if (*(_func_void_void_ptr **)((long)arg + 0x10) != lang_func->java_isr_callback) {
              return (void *)0x0;
            }
            (*lang_func->java_delete_global_ref)(*(void **)((long)arg + 0x18));
            (*lang_func->java_detach_thread)();
            return (void *)0x0;
          }
        }
        if (*(int *)((long)arg + 0x2c) != 0) goto LAB_0010b021;
        pthread_setcancelstate(1,(int *)0x0);
        if (lang_func->python_isr == (_func_void__func_void_void_ptr_ptr_void_ptr *)0x0) {
          (**(_func_void_void_ptr **)((long)arg + 0x10))();
        }
        else {
          (*lang_func->python_isr)
                    (*(_func_void_void_ptr **)((long)arg + 0x10),*(void **)((long)arg + 0x18));
        }
        pthread_setcancelstate(0,(int *)0x0);
      } while( true );
    }
    pcVar8 = "mraa_gpio_interrupt_handler_multiple() malloc error";
  }
  syslog(3,pcVar8);
  return (void *)0x0;
}

Assistant:

static void*
mraa_gpio_interrupt_handler(void* arg)
{
    if (arg == NULL) {
        syslog(LOG_ERR, "gpio: interrupt_handler: context is invalid");
        return NULL;
    }

    mraa_result_t ret;
    mraa_gpio_context dev = (mraa_gpio_context) arg;
    int idx = 0;

    if (IS_FUNC_DEFINED(dev, gpio_interrupt_handler_init_replace)) {
        if (dev->advance_func->gpio_interrupt_handler_init_replace(dev) != MRAA_SUCCESS)
            return NULL;
    }

    int* fps = calloc(dev->num_pins, sizeof(int));
    if (!fps) {
        syslog(LOG_ERR, "mraa_gpio_interrupt_handler_multiple() malloc error");
        return NULL;
    }

    /* Is this pin on a subplatform? Do nothing... */
    if (mraa_is_sub_platform_id(dev->pin)) {
    }
    /* Is the platform chardev_capable? */
    else if (plat->chardev_capable) {
        mraa_gpiod_group_t gpio_group;

        for_each_gpio_group(gpio_group, dev)
        {
            for (int i = 0; i < gpio_group->num_gpio_lines; ++i) {
                fps[idx++] = gpio_group->event_handles[i];
            }
        }
    }
    /* Else, attempt fs access */
    else {
        mraa_gpio_context it = dev;

        while (it) {
            // open gpio value with open(3)
            char bu[MAX_SIZE];
            snprintf(bu, MAX_SIZE, SYSFS_CLASS_GPIO "/gpio%d/value", it->pin);
            fps[idx] = open(bu, O_RDONLY);
            if (fps[idx] < 0) {
                syslog(LOG_ERR, "gpio%i: interrupt_handler: failed to open 'value' : %s", it->pin,
                       strerror(errno));
                mraa_gpio_close_event_handles_sysfs(fps, idx);
                return NULL;
            }

            idx++;
            it = it->next;
        }
    }

#ifndef HAVE_PTHREAD_CANCEL
    if (pipe(dev->isr_control_pipe)) {
        syslog(LOG_ERR, "gpio%i: interrupt_handler: failed to create isr control pipe: %s",
               dev->pin, strerror(errno));
        mraa_gpio_close_event_handles_sysfs(fps, dev->num_pins);
        return NULL;
    }
#endif

    if (lang_func->java_attach_thread != NULL) {
        if (dev->isr == lang_func->java_isr_callback) {
            if (lang_func->java_attach_thread() != MRAA_SUCCESS) {
                mraa_gpio_close_event_handles_sysfs(fps, dev->num_pins);
                return NULL;
            }
        }
    }

    for (;;) {
        if (IS_FUNC_DEFINED(dev, gpio_wait_interrupt_replace)) {
            ret = dev->advance_func->gpio_wait_interrupt_replace(dev);
        } else {
            if (plat->chardev_capable) {
                ret = mraa_gpio_chardev_wait_interrupt(fps, idx, dev->events);
            } else {
                ret = mraa_gpio_wait_interrupt(fps, idx
#ifndef HAVE_PTHREAD_CANCEL
                                               ,
                                               dev->isr_control_pipe[0]
#endif
                                               ,
                                               dev->events);
            }
        }

        if (ret == MRAA_SUCCESS && !dev->isr_thread_terminating) {
#ifdef HAVE_PTHREAD_CANCEL
            pthread_setcancelstate(PTHREAD_CANCEL_DISABLE, NULL);
#endif
            if (lang_func->python_isr != NULL) {
                lang_func->python_isr(dev->isr, dev->isr_args);
            } else {
                dev->isr(dev->isr_args);
            }
#ifdef HAVE_PTHREAD_CANCEL
            pthread_setcancelstate(PTHREAD_CANCEL_ENABLE, NULL);
#endif
        } else {
            // we must have got an error code or exit request so die nicely
#ifdef HAVE_PTHREAD_CANCEL
            pthread_setcancelstate(PTHREAD_CANCEL_DISABLE, NULL);
#endif
            mraa_gpio_close_event_handles_sysfs(fps, dev->num_pins);

            if (lang_func->java_detach_thread != NULL && lang_func->java_delete_global_ref != NULL) {
                if (dev->isr == lang_func->java_isr_callback) {
                    lang_func->java_delete_global_ref(dev->isr_args);
                    lang_func->java_detach_thread();
                }
            }

            return NULL;
        }
    }
}